

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatchOut.cpp
# Opt level: O0

int Bmatch_Output(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,vector<Node,_std::allocator<Node>_> *inGroup,
                 vector<Node,_std::allocator<Node>_> *outGroup,
                 vector<Node,_std::allocator<Node>_> *constGroup,int *maxScore,char *filename)

{
  byte bVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  size_type sVar4;
  ostream *poVar5;
  reference pvVar6;
  char *pcVar7;
  char *local_390;
  char *local_340;
  char *local_2c0;
  int local_268;
  int local_264;
  int j_2;
  int j_1;
  int j;
  ostream local_250 [8];
  ofstream f;
  Abc_Obj_t *pObj;
  int score;
  int i;
  int *maxScore_local;
  vector<Node,_std::allocator<Node>_> *constGroup_local;
  vector<Node,_std::allocator<Node>_> *outGroup_local;
  vector<Node,_std::allocator<Node>_> *inGroup_local;
  Abc_Ntk_t *pNtk2_local;
  Abc_Ntk_t *pNtk1_local;
  
  pObj._0_4_ = 0;
  for (pObj._4_4_ = 0; iVar2 = Abc_NtkPoNum(pNtk1), pObj._4_4_ < iVar2; pObj._4_4_ = pObj._4_4_ + 1)
  {
    Abc_NtkPo(pNtk1,pObj._4_4_);
    sVar4 = std::vector<Node,_std::allocator<Node>_>::size(outGroup + pObj._4_4_);
    if (sVar4 != 0) {
      sVar4 = std::vector<Node,_std::allocator<Node>_>::size(outGroup + pObj._4_4_);
      pObj._0_4_ = (int)pObj + (int)sVar4 + 0xb;
    }
  }
  if (*maxScore < (int)pObj) {
    std::ofstream::ofstream(local_250,filename,_S_out);
    for (pObj._4_4_ = 0; iVar2 = Abc_NtkPoNum(pNtk1), pObj._4_4_ < iVar2;
        pObj._4_4_ = pObj._4_4_ + 1) {
      pAVar3 = Abc_NtkPo(pNtk1,pObj._4_4_);
      sVar4 = std::vector<Node,_std::allocator<Node>_>::size(outGroup + pObj._4_4_);
      if (sVar4 != 0) {
        poVar5 = std::operator<<(local_250,"OUTGROUP");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<(local_250,"1 + ");
        pcVar7 = Abc_ObjName(pAVar3);
        poVar5 = std::operator<<(poVar5,pcVar7);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        for (j_2 = 0; sVar4 = std::vector<Node,_std::allocator<Node>_>::size(outGroup + pObj._4_4_),
            (ulong)(long)j_2 < sVar4; j_2 = j_2 + 1) {
          poVar5 = std::operator<<(local_250,"2 ");
          pvVar6 = std::vector<Node,_std::allocator<Node>_>::operator[]
                             (outGroup + pObj._4_4_,(long)j_2);
          if ((pvVar6->inv & 1U) == 0) {
            local_2c0 = "+ ";
          }
          else {
            local_2c0 = "- ";
          }
          poVar5 = std::operator<<(poVar5,local_2c0);
          pvVar6 = std::vector<Node,_std::allocator<Node>_>::operator[]
                             (outGroup + pObj._4_4_,(long)j_2);
          pAVar3 = Abc_NtkPo(pNtk2,pvVar6->id);
          pcVar7 = Abc_ObjName(pAVar3);
          poVar5 = std::operator<<(poVar5,pcVar7);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        poVar5 = std::operator<<(local_250,"END");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
    }
    for (pObj._4_4_ = 0; iVar2 = Abc_NtkPiNum(pNtk1), pObj._4_4_ < iVar2;
        pObj._4_4_ = pObj._4_4_ + 1) {
      pAVar3 = Abc_NtkPi(pNtk1,pObj._4_4_);
      sVar4 = std::vector<Node,_std::allocator<Node>_>::size(inGroup + pObj._4_4_);
      if (sVar4 != 0) {
        poVar5 = std::operator<<(local_250,"INGROUP");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<(local_250,"1 + ");
        pcVar7 = Abc_ObjName(pAVar3);
        poVar5 = std::operator<<(poVar5,pcVar7);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        for (local_264 = 0;
            sVar4 = std::vector<Node,_std::allocator<Node>_>::size(inGroup + pObj._4_4_),
            (ulong)(long)local_264 < sVar4; local_264 = local_264 + 1) {
          poVar5 = std::operator<<(local_250,"2 ");
          pvVar6 = std::vector<Node,_std::allocator<Node>_>::operator[]
                             (inGroup + pObj._4_4_,(long)local_264);
          if ((pvVar6->inv & 1U) == 0) {
            local_340 = "+ ";
          }
          else {
            local_340 = "- ";
          }
          poVar5 = std::operator<<(poVar5,local_340);
          pvVar6 = std::vector<Node,_std::allocator<Node>_>::operator[]
                             (inGroup + pObj._4_4_,(long)local_264);
          pAVar3 = Abc_NtkPi(pNtk2,pvVar6->id);
          pcVar7 = Abc_ObjName(pAVar3);
          poVar5 = std::operator<<(poVar5,pcVar7);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        poVar5 = std::operator<<(local_250,"END");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
    }
    sVar4 = std::vector<Node,_std::allocator<Node>_>::size(constGroup);
    if (sVar4 != 0) {
      poVar5 = std::operator<<(local_250,"CONST0GROUP");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      for (local_268 = 0; sVar4 = std::vector<Node,_std::allocator<Node>_>::size(constGroup),
          (ulong)(long)local_268 < sVar4; local_268 = local_268 + 1) {
        poVar5 = std::operator<<(local_250,"2 ");
        pvVar6 = std::vector<Node,_std::allocator<Node>_>::operator[](constGroup,(long)local_268);
        if ((pvVar6->inv & 1U) == 0) {
          local_390 = "+ ";
        }
        else {
          local_390 = "- ";
        }
        poVar5 = std::operator<<(poVar5,local_390);
        pvVar6 = std::vector<Node,_std::allocator<Node>_>::operator[](constGroup,(long)local_268);
        pAVar3 = Abc_NtkPi(pNtk2,pvVar6->id);
        pcVar7 = Abc_ObjName(pAVar3);
        poVar5 = std::operator<<(poVar5,pcVar7);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      poVar5 = std::operator<<(local_250,"END");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::ofstream::is_open();
    if ((bVar1 & 1) != 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Create \"");
      poVar5 = std::operator<<(poVar5,filename);
      poVar5 = std::operator<<(poVar5,"\" success!");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    std::ofstream::close();
    std::ofstream::~ofstream(local_250);
  }
  return (int)pObj;
}

Assistant:

int Bmatch_Output( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, vector<Node> * inGroup, vector<Node> * outGroup, vector<Node> * constGroup, const int & maxScore, const char* filename )
{    
    // For loops
    int i, score = 0;
    Abc_Obj_t * pObj;
 
    Abc_NtkForEachPo( pNtk1, pObj, i )
    {
        if(outGroup[i].size()){
            score += 11 + outGroup[i].size();
        }
    }    
    if( score <= maxScore )
        return score;

    ofstream f(filename);
    // ostream & f = cout; // For debugging
    
    Abc_NtkForEachPo( pNtk1, pObj, i )
    {
        if(outGroup[i].size())
        {
            f << "OUTGROUP" << endl;
            f << "1 + " << Abc_ObjName( pObj ) << endl;
            for (int j = 0; j < outGroup[i].size(); ++j)
                f << "2 " << (outGroup[i][j].inv ? "- " : "+ ") <<  Abc_ObjName( Abc_NtkPo(pNtk2, outGroup[i][j].id) ) << endl;
            f << "END" << endl;
        }
    }

    Abc_NtkForEachPi( pNtk1, pObj, i )
    {
        if(inGroup[i].size())
        {
            f << "INGROUP" << endl;
            f << "1 + " << Abc_ObjName( pObj ) << endl;
            for (int j = 0; j < inGroup[i].size(); ++j)
                f << "2 " << (inGroup[i][j].inv ? "- " : "+ ") <<  Abc_ObjName( Abc_NtkPi(pNtk2, inGroup[i][j].id) ) << endl;
            f << "END" << endl;
        }
    }

    if((*constGroup).size())
    {
        f << "CONST0GROUP" << endl;
        for (int j = 0; j < (*constGroup).size(); ++j)
            f << "2 " << ((*constGroup)[j].inv ? "- " : "+ ") << Abc_ObjName( Abc_NtkPi(pNtk2, (*constGroup)[j].id) ) << endl;
        f << "END" << endl;
    }

    if (f.is_open()) cout << "Create \"" << filename << "\" success!" << endl;
    f.close();
    return score;
}